

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O2

void __thiscall Hpipe::Cond::Range::write_cpp(Range *this,ostream *os,string *var,bool in_or)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined7 in_register_00000009;
  char *pcVar6;
  int *piVar7;
  
  iVar4 = this->beg;
  if ((int)CONCAT71(in_register_00000009,in_or) == 0) {
LAB_0014d077:
    bVar3 = false;
LAB_0014d07f:
    iVar1 = this->end;
    if (iVar4 == iVar1) goto LAB_0014d087;
    if (iVar1 < 0xff && iVar4 != 0) {
      poVar5 = std::operator<<(os,(string *)var);
      poVar5 = std::operator<<(poVar5," >= ");
      poVar5 = cc(poVar5,this->beg);
      poVar5 = std::operator<<(poVar5," and ");
LAB_0014d11a:
      poVar5 = std::operator<<(poVar5,(string *)var);
      poVar5 = std::operator<<(poVar5," <= ");
      iVar4 = this->end;
      goto LAB_0014d132;
    }
    poVar5 = os;
    if (iVar1 < 0xff) goto LAB_0014d11a;
    if (iVar4 != 0) {
      poVar5 = std::operator<<(os,(string *)var);
      pcVar6 = " >= ";
      goto LAB_0014d09d;
    }
    iVar4 = 0;
    if ((this->exceptions).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (this->exceptions).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish)
    goto LAB_0014d13d;
    std::operator<<(os,"true");
  }
  else {
    if (iVar4 != this->end) {
      if ((iVar4 == 0 || 0xfe < this->end) &&
         ((this->exceptions).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
          (this->exceptions).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start))
      goto LAB_0014d077;
      std::operator<<(os,"( ");
      iVar4 = this->beg;
      bVar3 = true;
      goto LAB_0014d07f;
    }
    bVar3 = false;
LAB_0014d087:
    poVar5 = std::operator<<(os,(string *)var);
    pcVar6 = " == ";
LAB_0014d09d:
    poVar5 = std::operator<<(poVar5,pcVar6);
    iVar4 = this->beg;
LAB_0014d132:
    cc(poVar5,iVar4);
  }
  iVar4 = 1;
LAB_0014d13d:
  piVar2 = (this->exceptions).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  for (piVar7 = (this->exceptions).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar7 != piVar2; piVar7 = piVar7 + 1) {
    iVar1 = *piVar7;
    pcVar6 = " and ";
    if (iVar4 == 0) {
      pcVar6 = "";
    }
    poVar5 = std::operator<<(os,pcVar6);
    poVar5 = std::operator<<(poVar5,(string *)var);
    poVar5 = std::operator<<(poVar5," != ");
    cc(poVar5,iVar1);
    iVar4 = iVar4 + 1;
  }
  if (!bVar3) {
    return;
  }
  std::operator<<(os," )");
  return;
}

Assistant:

void Cond::Range::write_cpp( std::ostream &os, const std::string &var, bool in_or ) const {
    bool par = in_or and beg != end and ( ( beg and end < 255 ) or exceptions.size() );
    if ( par )
        os << "( ";

    int cpt = 1;
    if ( beg == end )
        cc( os << var << " == ", beg );
    else if ( beg and end < 255 )
        cc( cc( os <<  var << " >= ", beg ) << " and " << var << " <= ", end );
    else if ( end < 255 )
        cc( os << var << " <= ", end );
    else if ( beg )
        cc( os << var << " >= ", beg );
    else if ( exceptions.empty() )
        os << "true";
    else
        cpt = 0;

    for( int v : exceptions )
        cc( os << ( cpt++ ? " and " : "" ) << var << " != ", v );

    if ( par )
        os << " )";
}